

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_get_extpri_stream_priority
              (nghttp2_session *session,nghttp2_extpri *extpri,int32_t stream_id)

{
  void *pvVar1;
  int iVar2;
  
  if (session->server == '\0') {
    iVar2 = -0x207;
  }
  else {
    iVar2 = 0;
    if ((session->pending_no_rfc7540_priorities == '\x01') && (iVar2 = -0x1f5, stream_id != 0)) {
      pvVar1 = nghttp2_map_find(&session->streams,stream_id);
      if (pvVar1 != (void *)0x0) {
        nghttp2_extpri_from_uint8(extpri,*(uint8_t *)((long)pvVar1 + 0xdc));
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int nghttp2_session_get_extpri_stream_priority(nghttp2_session *session,
                                               nghttp2_extpri *extpri,
                                               int32_t stream_id) {
  nghttp2_stream *stream;

  if (!session->server) {
    return NGHTTP2_ERR_INVALID_STATE;
  }

  if (session->pending_no_rfc7540_priorities != 1) {
    return 0;
  }

  if (stream_id == 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  stream = nghttp2_session_get_stream_raw(session, stream_id);
  if (!stream) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  nghttp2_extpri_from_uint8(extpri, stream->extpri);

  return 0;
}